

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O1

int lyxp_node_check_syntax(lys_node *node)

{
  LYS_NODE LVar1;
  ly_ctx *ctx;
  ushort uVar2;
  int iVar3;
  ulong in_RAX;
  lys_node *plVar4;
  lyxp_expr *exp;
  char *pcVar5;
  byte bVar6;
  long lVar7;
  undefined8 uStack_38;
  uint16_t exp_idx;
  
  LVar1 = node->nodetype;
  plVar4 = (lys_node *)0x0;
  bVar6 = 0;
  if ((int)LVar1 < 0x80) {
    if ((int)LVar1 < 0x10) {
      pcVar5 = (char *)0x0;
      switch(LVar1) {
      case LYS_CONTAINER:
        plVar4 = (lys_node *)node[1].name;
        pcVar5 = node[1].dsc;
        bVar6 = node->padding[1];
        break;
      case LYS_CHOICE:
switchD_00178c95_caseD_2:
        plVar4 = *(lys_node **)node->hash;
      default:
switchD_00178c95_default:
        bVar6 = 0;
        pcVar5 = (char *)0x0;
        break;
      case LYS_CHOICE|LYS_CONTAINER:
      case LYS_LEAF|LYS_CONTAINER:
      case LYS_LEAF|LYS_CHOICE:
      case LYS_LEAF|LYS_CHOICE|LYS_CONTAINER:
        break;
      case LYS_LEAF:
      case LYS_LEAFLIST:
switchD_00178c95_caseD_4:
        pcVar5 = node[1].dsc;
        bVar6 = node->padding[3];
        plVar4 = (lys_node *)node[1].name;
      }
    }
    else if (LVar1 == LYS_LIST) {
      pcVar5 = node[1].dsc;
      bVar6 = node->padding[0];
      plVar4 = (lys_node *)node[1].name;
    }
    else {
      if (LVar1 == LYS_ANYXML) goto switchD_00178c95_caseD_4;
      pcVar5 = (char *)0x0;
      if (LVar1 == LYS_CASE) goto switchD_00178c95_caseD_2;
    }
  }
  else {
    plVar4 = (lys_node *)0x0;
    if ((int)LVar1 < 0x1000) {
      if (LVar1 == LYS_NOTIF) {
        pcVar5 = node[1].dsc;
      }
      else {
        if ((LVar1 != LYS_INPUT) && (pcVar5 = (char *)0x0, LVar1 != LYS_OUTPUT))
        goto switchD_00178c95_caseD_3;
        pcVar5 = node[1].name;
      }
      bVar6 = node->padding[1];
      plVar4 = (lys_node *)0x0;
    }
    else {
      if (LVar1 == LYS_USES) goto switchD_00178c95_caseD_2;
      if (LVar1 == LYS_AUGMENT) {
        plVar4 = node->next;
        goto switchD_00178c95_default;
      }
      pcVar5 = (char *)0x0;
      if (LVar1 == LYS_ANYDATA) goto switchD_00178c95_caseD_4;
    }
  }
switchD_00178c95_caseD_3:
  uStack_38 = in_RAX;
  if (plVar4 == (lys_node *)0x0) {
LAB_00178d98:
    if (bVar6 != 0) {
      lVar7 = 0;
      do {
        exp = lyxp_parse_expr(node->module->ctx,*(char **)(pcVar5 + lVar7));
        if (exp == (lyxp_expr *)0x0) goto LAB_00178e47;
        uStack_38 = uStack_38 & 0xffffffffffff;
        iVar3 = reparse_or_expr(node->module->ctx,exp,(uint16_t *)((long)&uStack_38 + 6));
        if (iVar3 != 0) goto LAB_00178e3f;
        uVar2 = uStack_38._6_2_;
        if (uStack_38._6_2_ != exp->used) goto LAB_00178e06;
        lyxp_expr_free(exp);
        lVar7 = lVar7 + 0x38;
      } while ((ulong)bVar6 * 0x38 - lVar7 != 0);
    }
    iVar3 = 0;
  }
  else {
    exp = lyxp_parse_expr(node->module->ctx,plVar4->name);
    if (exp != (lyxp_expr *)0x0) {
      uStack_38 = uStack_38 & 0xffffffffffff;
      iVar3 = reparse_or_expr(node->module->ctx,exp,(uint16_t *)((long)&uStack_38 + 6));
      if (iVar3 == 0) {
        uVar2 = uStack_38._6_2_;
        if (uStack_38._6_2_ == exp->used) {
          lyxp_expr_free(exp);
          goto LAB_00178d98;
        }
LAB_00178e06:
        ctx = node->module->ctx;
        pcVar5 = print_token(exp->tokens[uVar2]);
        ly_vlog(ctx,LYE_XPATH_INTOK,LY_VLOG_NONE,(void *)0x0,pcVar5,exp->expr + exp->expr_pos[uVar2]
               );
      }
LAB_00178e3f:
      lyxp_expr_free(exp);
    }
LAB_00178e47:
    iVar3 = -1;
  }
  return iVar3;
}

Assistant:

int
lyxp_node_check_syntax(const struct lys_node *node)
{
    uint8_t must_size = 0;
    uint16_t exp_idx;
    uint32_t i;
    struct lys_when *when = NULL;
    struct lys_restr *must = NULL;
    struct lyxp_expr *expr;

    switch (node->nodetype) {
    case LYS_CONTAINER:
        when = ((struct lys_node_container *)node)->when;
        must = ((struct lys_node_container *)node)->must;
        must_size = ((struct lys_node_container *)node)->must_size;
        break;
    case LYS_CHOICE:
        when = ((struct lys_node_choice *)node)->when;
        break;
    case LYS_LEAF:
        when = ((struct lys_node_leaf *)node)->when;
        must = ((struct lys_node_leaf *)node)->must;
        must_size = ((struct lys_node_leaf *)node)->must_size;
        break;
    case LYS_LEAFLIST:
        when = ((struct lys_node_leaflist *)node)->when;
        must = ((struct lys_node_leaflist *)node)->must;
        must_size = ((struct lys_node_leaflist *)node)->must_size;
        break;
    case LYS_LIST:
        when = ((struct lys_node_list *)node)->when;
        must = ((struct lys_node_list *)node)->must;
        must_size = ((struct lys_node_list *)node)->must_size;
        break;
    case LYS_ANYXML:
    case LYS_ANYDATA:
        when = ((struct lys_node_anydata *)node)->when;
        must = ((struct lys_node_anydata *)node)->must;
        must_size = ((struct lys_node_anydata *)node)->must_size;
        break;
    case LYS_CASE:
        when = ((struct lys_node_case *)node)->when;
        break;
    case LYS_NOTIF:
        must = ((struct lys_node_notif *)node)->must;
        must_size = ((struct lys_node_notif *)node)->must_size;
        break;
    case LYS_INPUT:
    case LYS_OUTPUT:
        must = ((struct lys_node_inout *)node)->must;
        must_size = ((struct lys_node_inout *)node)->must_size;
        break;
    case LYS_USES:
        when = ((struct lys_node_uses *)node)->when;
        break;
    case LYS_AUGMENT:
        when = ((struct lys_node_augment *)node)->when;
        break;
    default:
        /* nothing to check */
        break;
    }

    /* check "when" */
    if (when) {
        expr = lyxp_parse_expr(node->module->ctx, when->cond);
        if (!expr) {
            return -1;
        }

        exp_idx = 0;
        if (reparse_or_expr(node->module->ctx, expr, &exp_idx)) {
            lyxp_expr_free(expr);
            return -1;
        } else if (exp_idx != expr->used) {
            LOGVAL(node->module->ctx, LYE_XPATH_INTOK, LY_VLOG_NONE, NULL,
                   print_token(expr->tokens[exp_idx]), &expr->expr[expr->expr_pos[exp_idx]]);
            lyxp_expr_free(expr);
            return -1;
        }
        lyxp_expr_free(expr);
    }

    /* check "must" */
    for (i = 0; i < must_size; ++i) {
        expr = lyxp_parse_expr(node->module->ctx, must[i].expr);
        if (!expr) {
            return -1;
        }

        exp_idx = 0;
        if (reparse_or_expr(node->module->ctx, expr, &exp_idx)) {
            lyxp_expr_free(expr);
            return -1;
        } else if (exp_idx != expr->used) {
            LOGVAL(node->module->ctx, LYE_XPATH_INTOK, LY_VLOG_NONE, NULL,
                   print_token(expr->tokens[exp_idx]), &expr->expr[expr->expr_pos[exp_idx]]);
            lyxp_expr_free(expr);
            return -1;
        }
        lyxp_expr_free(expr);
    }

    return 0;
}